

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnImportTag
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index tag_index,Index sig_index)

{
  string_view sVar1;
  
  PrintDetails(this," - tag[%u] sig=%u",(ulong)tag_index,(ulong)sig_index,field_name._M_len,
               field_name._M_str);
  sVar1 = BinaryReaderObjdumpBase::GetTagName(&this->super_BinaryReaderObjdumpBase,tag_index);
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name._M_len & 0xffffffff,module_name._M_str,
               field_name._M_len & 0xffffffff,field_name._M_str);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportTag(Index import_index,
                                        std::string_view module_name,
                                        std::string_view field_name,
                                        Index tag_index,
                                        Index sig_index) {
  PrintDetails(" - tag[%" PRIindex "] sig=%" PRIindex, tag_index, sig_index);
  auto name = GetTagName(tag_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}